

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O3

ProString * __thiscall
QMakeProperty::value(ProString *__return_storage_ptr__,QMakeProperty *this,ProKey *vk)

{
  QSettings *pQVar1;
  long in_FS_OFFSET;
  QAnyStringView QVar2;
  ProString val;
  QString local_a8;
  QString local_90;
  ProString local_78;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.m_file = -0x55555556;
  local_78._36_4_ = 0xaaaaaaaa;
  local_78.m_hash = 0xaaaaaaaaaaaaaaaa;
  local_78.m_string.d.size = -0x5555555555555556;
  local_78.m_offset = -0x55555556;
  local_78.m_length = -0x55555556;
  local_78.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_78.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QHash<ProKey,_ProString>::value(&local_78,&this->m_values,vk);
  if (local_78.m_string.d.ptr == (char16_t *)0x0) {
    initSettings(this);
    pQVar1 = this->settings;
    ProString::toQString(&local_a8,&vk->super_ProString);
    QVar2.m_size = (size_t)pQVar1;
    QVar2.field_0.m_data = &local_48;
    QSettings::value(QVar2);
    QVariant::toString();
    ProString::ProString(__return_storage_ptr__,&local_90);
    if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
      }
    }
    QVariant::~QVariant(&local_48);
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    ProString::ProString(__return_storage_ptr__,&local_78);
  }
  if (&(local_78.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProString
QMakeProperty::value(const ProKey &vk)
{
    ProString val = m_values.value(vk);
    if (!val.isNull())
        return val;

    initSettings();
    return settings->value(vk.toQString()).toString();
}